

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract(defV *data,Time *val)

{
  int iVar1;
  pointer pdVar2;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *this;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  int *piVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  TimeRepresentation<count_time<9,_long>_> TVar8;
  size_type sVar9;
  char *extraout_RDX;
  char **__endptr;
  char *pcVar10;
  baseType bVar11;
  double dVar12;
  string_view timeString;
  string_view val_00;
  string_view val_01;
  char *local_38;
  
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar3 = (variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    goto LAB_00263356;
  default:
    pvVar4 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    TVar8.internalTimeCode = *pvVar4;
    goto LAB_002634d4;
  case '\x02':
    pvVar5 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    pcVar10 = (pvVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    *piVar6 = 0;
    __endptr = &local_38;
    TVar8.internalTimeCode = strtoll(pcVar10,__endptr,10);
    if (local_38 == pcVar10) {
      std::__throw_invalid_argument("stoll");
    }
    else if (*piVar6 != 0x22) {
      if (*piVar6 == 0) {
        *piVar6 = iVar1;
      }
      if (((long)local_38 - (long)pcVar10 != 0xffffffffffffffff) &&
         ((long)local_38 - (long)pcVar10 != pvVar5->_M_string_length)) {
        pvVar5 = std::
                 get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                           (data);
        timeString._M_str = extraout_RDX;
        timeString._M_len = (size_t)(pvVar5->_M_dataplus)._M_p;
        TVar8 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                          ((utilities *)pvVar5->_M_string_length,timeString);
      }
      goto LAB_002634d4;
    }
    pcVar10 = "stoll";
    std::__throw_out_of_range("stoll");
LAB_00263573:
    val_01._M_str = (char *)__endptr;
    val_01._M_len = (size_t)pcVar10;
    TVar8.internalTimeCode = getIntFromString(val_01);
    goto LAB_002634d4;
  case '\x03':
    pvVar3 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
LAB_00263356:
    bVar11 = 0x7fffffffffffffff;
    dVar12 = *(double *)pvVar3->_M_value;
    if (dVar12 <= -9223372036.854765) {
      bVar11 = -0x7fffffffffffffff;
    }
    else if (dVar12 < 9223372036.854765) {
      bVar11 = (baseType)
               (dVar12 * 1000000000.0 +
               *(double *)(&DAT_00415560 + (ulong)(0.0 <= dVar12 * 1000000000.0) * 8));
    }
    val->internalTimeCode = bVar11;
    return;
  case '\x04':
    pvVar7 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    break;
  case '\x05':
    pvVar7 = (variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    break;
  case '\x06':
    this = std::
           get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     (data);
    dVar12 = this->value;
    if (NAN(dVar12)) {
      sVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(&this->name,".[eE",0,4);
      __endptr = (char **)(this->name)._M_dataplus._M_p;
      pcVar10 = (char *)(this->name)._M_string_length;
      if (sVar9 != 0xffffffffffffffff) {
        bVar11 = 0x7fffffffffffffff;
        val_00._M_str = (char *)__endptr;
        val_00._M_len = (size_t)pcVar10;
        dVar12 = getDoubleFromString(val_00);
        if (dVar12 <= -9223372036.854765) {
          bVar11 = -0x7fffffffffffffff;
        }
        else if (dVar12 < 9223372036.854765) {
          bVar11 = (baseType)
                   (dVar12 * 1000000000.0 +
                   *(double *)(&DAT_00415560 + (ulong)(0.0 <= dVar12 * 1000000000.0) * 8));
        }
        val->internalTimeCode = bVar11;
        return;
      }
      goto LAB_00263573;
    }
    goto LAB_0026348c;
  }
  pdVar2 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 == (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    TVar8.internalTimeCode = 0;
  }
  else {
    dVar12 = *pdVar2;
LAB_0026348c:
    TVar8.internalTimeCode = 0x7fffffffffffffff;
    if (dVar12 <= -9223372036.854765) {
      TVar8.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (dVar12 < 9223372036.854765) {
      TVar8.internalTimeCode =
           (baseType)
           (dVar12 * 1000000000.0 +
           *(double *)(&DAT_00415560 + (ulong)(0.0 <= dVar12 * 1000000000.0) * 8));
    }
  }
LAB_002634d4:
  val->internalTimeCode = TVar8.internalTimeCode;
  return;
}

Assistant:

void valueExtract(const defV& data, Time& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::get<double>(data);
            break;
        case int_loc:  // int64_t
        default:
            val.setBaseTimeCode(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        {
            size_t index;
            const auto& str = std::get<std::string>(data);
            try {
                auto timeCodeValue = std::stoll(str, &index);
                if ((index == std::string::npos) || (index == str.size())) {
                    val.setBaseTimeCode(timeCodeValue);
                } else {
                    val = gmlc::utilities::loadTimeFromString<helics::Time>(
                        std::get<std::string>(data));
                }
            }
            catch (...) {
                val = timeZero;
            }
            break;
        }
        case complex_loc:  // complex
            val = std::get<std::complex<double>>(data).real();
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = (!vec.empty()) ? Time(vec[0]) : timeZero;
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = (!vec.empty()) ? Time(vec[0].real()) : timeZero;
            break;
        }
        case named_point_loc:
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                if (point.name.find(".[eE") == std::string::npos) {
                    const std::int64_t intVal = getIntFromString(point.name);
                    val.setBaseTimeCode(intVal);
                } else {
                    val = getDoubleFromString(point.name);
                }
            } else {
                val = point.value;
            }
            break;
    }
}